

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void pqdownheap(deflate_state *s,ct_data *tree,int k)

{
  int iVar1;
  int local_24;
  int j;
  int v;
  int k_local;
  ct_data *tree_local;
  deflate_state *s_local;
  
  iVar1 = s->heap[k];
  j = k;
  for (local_24 = k << 1; local_24 <= s->heap_len; local_24 = local_24 << 1) {
    if ((local_24 < s->heap_len) &&
       ((tree[s->heap[local_24 + 1]].fc.freq < tree[s->heap[local_24]].fc.freq ||
        ((tree[s->heap[local_24 + 1]].fc.freq == tree[s->heap[local_24]].fc.freq &&
         (s->depth[s->heap[local_24 + 1]] <= s->depth[s->heap[local_24]])))))) {
      local_24 = local_24 + 1;
    }
    if ((tree[iVar1].fc.freq < tree[s->heap[local_24]].fc.freq) ||
       ((tree[iVar1].fc.freq == tree[s->heap[local_24]].fc.freq &&
        (s->depth[iVar1] <= s->depth[s->heap[local_24]])))) break;
    s->heap[j] = s->heap[local_24];
    j = local_24;
  }
  s->heap[j] = iVar1;
  return;
}

Assistant:

local void pqdownheap(deflate_state *s, ct_data *tree, int k) {
    int v = s->heap[k];
    int j = k << 1;  /* left son of k */
    while (j <= s->heap_len) {
        /* Set j to the smallest of the two sons: */
        if (j < s->heap_len &&
            smaller(tree, s->heap[j + 1], s->heap[j], s->depth)) {
            j++;
        }
        /* Exit if v is smaller than both sons */
        if (smaller(tree, v, s->heap[j], s->depth)) break;

        /* Exchange v with the smallest son */
        s->heap[k] = s->heap[j];  k = j;

        /* And continue down the tree, setting j to the left son of k */
        j <<= 1;
    }
    s->heap[k] = v;
}